

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::ArchiveIN(ChSystem *this,ChArchiveIn *marchive)

{
  element_type *peVar1;
  ChNameValue<std::shared_ptr<chrono::ChTimestepper>_> local_1b0;
  ChNameValue<std::shared_ptr<chrono::collision::ChCollisionSystem>_> local_198;
  ChNameValue<double> local_180;
  ChNameValue<double> local_168;
  ChNameValue<std::shared_ptr<chrono::ChSolver>_> local_150;
  ChNameValue<std::shared_ptr<chrono::ChSystemDescriptor>_> local_138;
  ChNameValue<bool> local_120;
  ChNameValue<int> local_108;
  ChNameValue<double> local_f0;
  ChNameValue<bool> local_d8;
  ChNameValue<unsigned_long> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChContactContainer>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChSystem>(marchive);
  ChAssembly::ArchiveIN(&this->assembly,marchive);
  local_30._value = &this->contact_container;
  local_30._name = "contact_container";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->G_acc;
  local_48._name = "G_acc";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->ch_time;
  local_60._name = "ch_time";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->step;
  local_78._name = "step";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->step_min;
  local_90._name = "step_min";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->step_max;
  local_a8._name = "step_max";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->stepcount;
  local_c0._name = "stepcount";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  local_d8._value = &this->write_matrix;
  local_d8._name = "write_matrix";
  local_d8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d8);
  local_f0._value = &this->tol_force;
  local_f0._name = "tol_force";
  local_f0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f0);
  local_108._value = &this->maxiter;
  local_108._name = "maxiter";
  local_108._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_108);
  local_120._value = &this->use_sleeping;
  local_120._name = "use_sleeping";
  local_120._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_120);
  local_138._value = &this->descriptor;
  local_138._name = "descriptor";
  local_138._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_138);
  local_150._value = &this->solver;
  local_150._name = "solver";
  local_150._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_150);
  local_168._value = &this->min_bounce_speed;
  local_168._name = "min_bounce_speed";
  local_168._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_168);
  local_180._value = &this->max_penetration_recovery_speed;
  local_180._name = "max_penetration_recovery_speed";
  local_180._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_180);
  local_198._value = &this->collision_system;
  local_198._name = "collision_system";
  local_198._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_198);
  local_1b0._value = &this->timestepper;
  local_1b0._name = "timestepper";
  local_1b0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_1b0);
  peVar1 = (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar1->_vptr_ChTimestepper[5])(peVar1,this);
  Reference_LM_byID(this);
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  return;
}

Assistant:

void ChSystem::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSystem>();

    // deserialize unerlying assembly
    assembly.ArchiveIN(marchive);

    // stream in all member data:

    marchive >> CHNVP(contact_container);

    marchive >> CHNVP(G_acc);
    marchive >> CHNVP(ch_time);
    marchive >> CHNVP(step);
    marchive >> CHNVP(step_min);
    marchive >> CHNVP(step_max);
    marchive >> CHNVP(stepcount);
    marchive >> CHNVP(write_matrix);

    marchive >> CHNVP(tol_force);
    marchive >> CHNVP(maxiter);
    marchive >> CHNVP(use_sleeping);

    marchive >> CHNVP(descriptor);
    marchive >> CHNVP(solver);

    marchive >> CHNVP(min_bounce_speed);
    marchive >> CHNVP(max_penetration_recovery_speed);

    marchive >> CHNVP(collision_system);  // ChCollisionSystem should implement class factory for abstract create

    marchive >> CHNVP(timestepper);  // ChTimestepper should implement class factory for abstract create
    timestepper->SetIntegrable(this);

    //***TODO*** complete...

    //  Rebuild link pointers to markers
    Reference_LM_byID();

    // Recompute statistics, offsets, etc.
    Setup();
}